

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandSeqSweep(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pAVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  uint local_d4;
  uint local_d0;
  uint local_cc;
  uint local_c8;
  uint local_c4;
  uint local_c0;
  uint local_bc;
  Fra_Ssw_t Pars;
  uint local_6c;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  
  pAVar3 = Abc_FrameReadNtk(pAbc);
  Pars.nPartSize = 0;
  Pars.nOverSize = 0;
  Pars.nFramesP = 0;
  Pars.nFramesK = 1;
  Pars.nMaxImps = 5000;
  Pars.nMaxLevs = 0;
  Pars.TimeLimit = 0.0;
  Pars.fUseImps = 0;
  local_bc = 0;
  Extra_UtilGetoptReset();
  local_d4 = Pars.nMaxLevs;
  local_d0 = Pars.nMaxImps;
  local_cc = Pars.nFramesK;
  local_c8 = Pars.nFramesP;
  local_c0 = Pars.nPartSize;
  local_c4 = Pars.nOverSize;
  local_68 = 1;
  local_44 = 0;
  local_48 = 0;
  local_4c = 0;
  local_6c = 0;
  local_64 = 0;
  local_54 = 0;
  local_58 = 0;
  local_50 = 0;
  local_5c = 0;
  local_60 = 0;
LAB_00237737:
  iVar1 = Extra_UtilGetopt(argc,argv,"PQNFILirfletvh");
  iVar4 = globalUtilOptind;
  switch(iVar1) {
  case 0x46:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_cc = uVar2;
      local_68 = uVar2;
LAB_00237873:
      globalUtilOptind = iVar4 + 1;
      if ((int)uVar2 < 1) goto switchD_00237763_caseD_67;
      goto LAB_00237737;
    }
    pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
    break;
  case 0x47:
  case 0x48:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4f:
    goto switchD_00237763_caseD_67;
  case 0x49:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_d0 = uVar2;
      goto LAB_00237873;
    }
    pcVar5 = "Command line switch \"-I\" should be followed by an integer.\n";
    break;
  case 0x4c:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_d4 = uVar2;
      local_44 = uVar2;
      goto LAB_00237873;
    }
    pcVar5 = "Command line switch \"-L\" should be followed by an integer.\n";
    break;
  case 0x4e:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_c8 = uVar2;
      local_6c = uVar2;
LAB_002378a8:
      globalUtilOptind = iVar4 + 1;
      if ((int)uVar2 < 0) goto switchD_00237763_caseD_67;
      goto LAB_00237737;
    }
    pcVar5 = "Command line switch \"-N\" should be followed by an integer.\n";
    break;
  case 0x50:
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-P\" should be followed by an integer.\n";
      break;
    }
    local_c0 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar4 + 1;
    local_4c = local_c0;
    if ((int)local_c0 < 2) {
switchD_00237763_caseD_67:
      Pars.fUseImps = local_bc;
      Pars.nMaxLevs = local_d4;
      Pars.nMaxImps = local_d0;
      Pars.nFramesK = local_cc;
      Pars.nFramesP = local_c8;
      Pars.nOverSize = local_c4;
      Pars.nPartSize = local_c0;
LAB_00237bb9:
      iVar4 = -2;
      Abc_Print(-2,"usage: ssweep [-PQNFL <num>] [-lrfetvh]\n");
      Abc_Print(-2,"\t         performs sequential sweep using K-step induction\n");
      Abc_Print(-2,"\t-P num : max partition size (0 = no partitioning) [default = %d]\n",
                (ulong)local_4c);
      Abc_Print(-2,"\t-Q num : partition overlap (0 = no overlap) [default = %d]\n",(ulong)local_48)
      ;
      Abc_Print(-2,"\t-N num : number of time frames to use as the prefix [default = %d]\n",
                (ulong)local_6c);
      Abc_Print(-2,"\t-F num : number of time frames for induction (1=simple) [default = %d]\n",
                (ulong)local_68);
      Abc_Print(-2,"\t-L num : max number of levels to consider (0=all) [default = %d]\n",
                (ulong)local_44);
      pcVar6 = "yes";
      pcVar5 = "yes";
      if (local_58 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-l     : toggle latch correspondence only [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_64 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle AIG rewriting [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_54 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n",pcVar5
               );
      pcVar5 = "yes";
      if (local_50 == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-e     : toggle writing implications as assertions [default = %s]\n",pcVar5);
      pcVar5 = "yes";
      if (local_5c == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-t     : toggle using one-hotness conditions [default = %s]\n",pcVar5);
      if (local_60 == 0) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle verbose output [default = %s]\n",pcVar6);
      pcVar5 = "\t-h     : print the command usage\n";
LAB_00237d11:
      Abc_Print(iVar4,pcVar5);
      return 1;
    }
    goto LAB_00237737;
  case 0x51:
    if (globalUtilOptind < argc) {
      uVar2 = atoi(argv[globalUtilOptind]);
      local_c4 = uVar2;
      local_48 = uVar2;
      goto LAB_002378a8;
    }
    pcVar5 = "Command line switch \"-Q\" should be followed by an integer.\n";
    break;
  default:
    switch(iVar1) {
    case 0x65:
      local_50 = local_50 ^ 1;
      break;
    case 0x66:
      local_54 = local_54 ^ 1;
      break;
    case 0x67:
    case 0x68:
    case 0x6a:
    case 0x6b:
      goto switchD_00237763_caseD_67;
    case 0x69:
      local_bc = local_bc ^ 1;
      break;
    case 0x6c:
      local_58 = local_58 ^ 1;
      break;
    default:
      if (iVar1 == 0x72) {
        local_64 = local_64 ^ 1;
      }
      else if (iVar1 == 0x74) {
        local_5c = local_5c ^ 1;
      }
      else {
        if (iVar1 != 0x76) {
          if (iVar1 == -1) {
            Pars.fUseImps = local_bc;
            Pars.nMaxLevs = local_d4;
            Pars.nMaxImps = local_d0;
            Pars.nFramesK = local_cc;
            Pars.nFramesP = local_c8;
            Pars.nOverSize = local_c4;
            Pars.nPartSize = local_c0;
            Pars.fVerbose = local_60;
            Pars.fUse1Hot = local_5c;
            Pars.fWriteImps = local_50;
            Pars.fLatchCorr = local_58;
            Pars.fFraiging = local_54;
            Pars.fRewrite = local_64;
            if (pAVar3 != (Abc_Ntk_t *)0x0) {
              if (pAVar3->nObjCounts[8] == 0) {
                pcVar5 = "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n";
                iVar4 = 0;
                goto LAB_00237d66;
              }
              if (pAVar3->ntkType == ABC_NTK_STRASH) {
                if (local_5c == 0 || local_68 < 2) {
                  if (local_6c == 0 || local_5c == 0) {
                    pAVar3 = Abc_NtkDarSeqSweep(pAVar3,&Pars);
                    if (pAVar3 != (Abc_Ntk_t *)0x0) {
                      Abc_FrameReplaceCurrentNetwork(pAbc,pAVar3);
                      return 0;
                    }
                    pcVar5 = "Sequential sweeping has failed.\n";
                    goto LAB_00237d36;
                  }
                  pcVar5 = "Currrently can only use one-hotness without prefix.\n";
                }
                else {
                  pcVar5 = "Currrently can only use one-hotness for simple induction (K=1).\n";
                }
              }
              else {
                pcVar5 = "This command works only for structrally hashed networks. Run \"st\".\n";
              }
              iVar4 = -1;
LAB_00237d66:
              Abc_Print(iVar4,pcVar5);
              return 0;
            }
            pcVar5 = "Empty network.\n";
LAB_00237d36:
            iVar4 = -1;
            goto LAB_00237d11;
          }
          goto switchD_00237763_caseD_67;
        }
        local_60 = local_60 ^ 1;
      }
    }
    goto LAB_00237737;
  }
  Pars.nMaxLevs = local_d4;
  Pars.nMaxImps = local_d0;
  Pars.nFramesK = local_cc;
  Pars.nFramesP = local_c8;
  Pars.nOverSize = local_c4;
  Pars.nPartSize = local_c0;
  Pars.fUseImps = local_bc;
  Abc_Print(-1,pcVar5);
  goto LAB_00237bb9;
}

Assistant:

int Abc_CommandSeqSweep( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk, * pNtkRes;
    Fra_Ssw_t Pars, * pPars = &Pars;
    int c;
    extern Abc_Ntk_t * Abc_NtkDarSeqSweep( Abc_Ntk_t * pNtk, Fra_Ssw_t * pPars );

    pNtk = Abc_FrameReadNtk(pAbc);
    // set defaults
    pPars->nPartSize  = 0;
    pPars->nOverSize  = 0;
    pPars->nFramesP   = 0;
    pPars->nFramesK   = 1;
    pPars->nMaxImps   = 5000;
    pPars->nMaxLevs   = 0;
    pPars->fUseImps   = 0;
    pPars->fRewrite   = 0;
    pPars->fFraiging  = 0;
    pPars->fLatchCorr = 0;
    pPars->fWriteImps = 0;
    pPars->fUse1Hot   = 0;
    pPars->fVerbose   = 0;
    pPars->TimeLimit  = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "PQNFILirfletvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nPartSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nPartSize < 2 )
                goto usage;
            break;
        case 'Q':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-Q\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nOverSize = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nOverSize < 0 )
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesP = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesP < 0 )
                goto usage;
            break;
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nFramesK = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nFramesK <= 0 )
                goto usage;
            break;
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxImps = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxImps <= 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nMaxLevs = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nMaxLevs <= 0 )
                goto usage;
            break;
        case 'i':
            pPars->fUseImps ^= 1;
            break;
        case 'r':
            pPars->fRewrite ^= 1;
            break;
        case 'f':
            pPars->fFraiging ^= 1;
            break;
        case 'l':
            pPars->fLatchCorr ^= 1;
            break;
        case 'e':
            pPars->fWriteImps ^= 1;
            break;
        case 't':
            pPars->fUse1Hot ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The network is combinational (run \"fraig\" or \"fraig_sweep\").\n" );
        return 0;
    }

    if ( !Abc_NtkIsStrash(pNtk) )
    {
        Abc_Print( -1, "This command works only for structrally hashed networks. Run \"st\".\n" );
        return 0;
    }

    if ( pPars->nFramesK > 1 && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness for simple induction (K=1).\n" );
        return 0;
    }

    if ( pPars->nFramesP && pPars->fUse1Hot )
    {
        Abc_Print( -1, "Currrently can only use one-hotness without prefix.\n" );
        return 0;
    }

    // get the new network
    pNtkRes = Abc_NtkDarSeqSweep( pNtk, pPars );
    if ( pNtkRes == NULL )
    {
        Abc_Print( -1, "Sequential sweeping has failed.\n" );
        return 1;
    }
    // replace the current network
    Abc_FrameReplaceCurrentNetwork( pAbc, pNtkRes );
    return 0;

usage:
    Abc_Print( -2, "usage: ssweep [-PQNFL <num>] [-lrfetvh]\n" );
    Abc_Print( -2, "\t         performs sequential sweep using K-step induction\n" );
    Abc_Print( -2, "\t-P num : max partition size (0 = no partitioning) [default = %d]\n", pPars->nPartSize );
    Abc_Print( -2, "\t-Q num : partition overlap (0 = no overlap) [default = %d]\n", pPars->nOverSize );
    Abc_Print( -2, "\t-N num : number of time frames to use as the prefix [default = %d]\n", pPars->nFramesP );
    Abc_Print( -2, "\t-F num : number of time frames for induction (1=simple) [default = %d]\n", pPars->nFramesK );
    Abc_Print( -2, "\t-L num : max number of levels to consider (0=all) [default = %d]\n", pPars->nMaxLevs );
//    Abc_Print( -2, "\t-I num : max number of implications to consider [default = %d]\n", pPars->nMaxImps );
//    Abc_Print( -2, "\t-i     : toggle using implications [default = %s]\n", pPars->fUseImps? "yes": "no" );
    Abc_Print( -2, "\t-l     : toggle latch correspondence only [default = %s]\n", pPars->fLatchCorr? "yes": "no" );
    Abc_Print( -2, "\t-r     : toggle AIG rewriting [default = %s]\n", pPars->fRewrite? "yes": "no" );
    Abc_Print( -2, "\t-f     : toggle fraiging (combinational SAT sweeping) [default = %s]\n", pPars->fFraiging? "yes": "no" );
    Abc_Print( -2, "\t-e     : toggle writing implications as assertions [default = %s]\n", pPars->fWriteImps? "yes": "no" );
    Abc_Print( -2, "\t-t     : toggle using one-hotness conditions [default = %s]\n", pPars->fUse1Hot? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle verbose output [default = %s]\n", pPars->fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}